

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

bool __thiscall GGSock::Communicator::Data::doConnect(Data *this)

{
  TSocketDescriptor *sock;
  bool bVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  long lVar5;
  int enable;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  long local_38;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  sock = &this->sd;
  local_38 = lVar3;
  while( true ) {
    if (this->isConnecting != true) {
      return false;
    }
    iVar2 = ::connect(*sock,(sockaddr *)&this->addr,0x10);
    if (-1 < iVar2) break;
    puVar4 = (uint *)__errno_location();
    if (*puVar4 == 0x6a) break;
    if (((*puVar4 & 0xfffffffe) != 0x72) &&
       (bVar1 = anon_unknown.dwarf_7a85::e_wouldBlock(), !bVar1)) {
      anon_unknown.dwarf_7a85::closeAndReset(sock);
      iVar2 = socket(2,1,6);
      *sock = iVar2;
      enable = 1;
      iVar2 = setsockopt(iVar2,1,2,&enable,4);
      if (iVar2 < 0) {
        fwrite("setsockopt(SO_REUSEADDR) failed",0x1f,1,_stderr);
      }
      iVar2 = setsockopt(*sock,1,0xf,&enable,4);
      if (iVar2 < 0) {
        fwrite("setsockopt(SO_REUSEPORT) failed",0x1f,1,_stderr);
      }
      anon_unknown.dwarf_7a85::setNonBlocking(sock);
      lVar3 = local_38;
    }
    if (this->timeoutConnect_ms < 1) {
      return false;
    }
    local_40.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_40);
    lVar5 = std::chrono::_V2::system_clock::now();
    if ((long)this->timeoutConnect_ms <= (lVar5 - lVar3) / 1000000) {
      anon_unknown.dwarf_7a85::closeAndReset(sock);
      this->isConnecting = false;
    }
  }
  this->sdpeer = this->sd;
  printf("Connected successfully, sd = %d\n");
  this->isConnected = true;
  this->isConnecting = false;
  return true;
}

Assistant:

bool doConnect() {
            auto tStart = std::chrono::high_resolution_clock::now();

            while (isConnecting) {
                auto rc = ::connect(sd, (struct sockaddr *) &addr, sizeof(addr));
                if (rc < 0 && e_isConnected() == false) {
                    if (e_inProgress() == false && e_wouldBlock() == false) {
                        ::closeAndReset(sd);
                        sd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);

                        int enable = 1;
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEADDR, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEADDR) failed");
                        }

#ifndef _WIN32
                        if (setsockopt(sd, SOL_SOCKET, SO_REUSEPORT, (char *)&enable, sizeof(int)) < 0) {
                            fprintf(stderr, "setsockopt(SO_REUSEPORT) failed");
                        }
#endif

                        //{
                        //    linger lin;
                        //    lin.l_onoff = 0;
                        //    lin.l_linger = 0;
                        //    if (setsockopt(sd, SOL_SOCKET, SO_LINGER, (const char *)&lin, sizeof(lin)) < 0) {
                        //        fprintf(stderr, "setsockopt(SO_LINGER) failed");
                        //    }
                        //}

                        ::setNonBlocking(sd);
                    }
                    if (timeoutConnect_ms > 0) {
                        std::this_thread::sleep_for(std::chrono::milliseconds(1));

                        auto tEnd = std::chrono::high_resolution_clock::now();
                        if (std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count() >= timeoutConnect_ms) {
                            ::closeAndReset(sd);
                            isConnecting = false;
                        }
                        continue;
                    }

                    return false;
                }

                sdpeer = sd;

                printf("Connected successfully, sd = %d\n", sd);

                isConnecting = false;
                isConnected = true;

                return true;
            }

            return false;
        }